

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

void __thiscall cpp_db::transaction::transaction(transaction *this,connection *conn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  runtime_error *this_00;
  __uniq_ptr_impl<cpp_db::transaction_interface,_std::default_delete<cpp_db::transaction_interface>_>
  local_20;
  
  (this->conn_impl).super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (conn->conn_impl).
           super___shared_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (conn->conn_impl).
           super___shared_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->conn_impl).super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  peVar2 = (conn->driver_impl).
           super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_driver_interface[6])(&local_20,peVar2,&conn->conn_impl);
  std::__shared_ptr<cpp_db::transaction_interface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cpp_db::transaction_interface,std::default_delete<cpp_db::transaction_interface>,void>
            ((__shared_ptr<cpp_db::transaction_interface,(__gnu_cxx::_Lock_policy)2> *)
             &this->trans_impl,
             (unique_ptr<cpp_db::transaction_interface,_std::default_delete<cpp_db::transaction_interface>_>
              *)&local_20);
  if (local_20._M_t.
      super__Tuple_impl<0UL,_cpp_db::transaction_interface_*,_std::default_delete<cpp_db::transaction_interface>_>
      .super__Head_base<0UL,_cpp_db::transaction_interface_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_cpp_db::transaction_interface_*,_std::default_delete<cpp_db::transaction_interface>_>
       )0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_cpp_db::transaction_interface_*,_std::default_delete<cpp_db::transaction_interface>_>
                          .super__Head_base<0UL,_cpp_db::transaction_interface_*,_false>.
                          _M_head_impl + 8))();
  }
  if ((this->trans_impl).
      super___shared_ptr<cpp_db::transaction_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"No transaction object from driver!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

transaction::transaction(const connection &conn)
    : conn_impl(conn.conn_impl)
    , trans_impl(conn.driver_impl->make_transaction(conn.conn_impl))
{
	if (!trans_impl)
		throw std::runtime_error("No transaction object from driver!");
}